

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

string * __thiscall
t_st_generator::prefix(string *__return_storage_ptr__,t_st_generator *this,string *class_name)

{
  t_program *this_00;
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  undefined1 local_75;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string prefix;
  string *class_name_local;
  t_st_generator *this_local;
  string *name;
  
  this_00 = (this->super_t_oop_generator).super_t_generator.program_;
  prefix.field_2._8_8_ = class_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"smalltalk.prefix",&local_61);
  t_program::get_namespace((string *)local_40,this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_75 = 0;
  std::__cxx11::string::string((string *)&local_98,(string *)class_name);
  t_generator::capitalize(__return_storage_ptr__,(t_generator *)this,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   __return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)&local_b8,(string *)__return_storage_ptr__);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_75 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::prefix(string class_name) {
  string prefix = program_->get_namespace("smalltalk.prefix");
  string name = capitalize(class_name);
  name = prefix.empty() ? name : (prefix + name);
  return name;
}